

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpxWrapper.cpp
# Opt level: O2

bool illegalIpxSolvedStatus(Info *ipx_info,HighsOptions *options)

{
  int iVar1;
  bool status_error;
  allocator local_1a1;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  iVar1 = (ipx_info->super_ipx_info).status_ipm;
  std::__cxx11::string::string
            ((string *)&local_40,"solved  status_ipm should not be IPX_STATUS_time_limit",&local_1a1
            );
  ipxStatusError(iVar1 == 6,options,&local_40,-1);
  std::__cxx11::string::~string((string *)&local_40);
  status_error = true;
  if (iVar1 != 6) {
    iVar1 = (ipx_info->super_ipx_info).status_ipm;
    std::__cxx11::string::string
              ((string *)&local_60,"solved  status_ipm should not be IPX_STATUS_iter_limit",
               &local_1a1);
    ipxStatusError(iVar1 == 7,options,&local_60,-1);
    std::__cxx11::string::~string((string *)&local_60);
    if (iVar1 != 7) {
      iVar1 = (ipx_info->super_ipx_info).status_ipm;
      std::__cxx11::string::string
                ((string *)&local_80,"solved  status_ipm should not be IPX_STATUS_no_progress",
                 &local_1a1);
      ipxStatusError(iVar1 == 8,options,&local_80,-1);
      std::__cxx11::string::~string((string *)&local_80);
      if (iVar1 != 8) {
        iVar1 = (ipx_info->super_ipx_info).status_ipm;
        std::__cxx11::string::string
                  ((string *)&local_a0,"solved  status_ipm should not be IPX_STATUS_failed",
                   &local_1a1);
        ipxStatusError(iVar1 == 9,options,&local_a0,-1);
        std::__cxx11::string::~string((string *)&local_a0);
        if (iVar1 != 9) {
          iVar1 = (ipx_info->super_ipx_info).status_ipm;
          std::__cxx11::string::string
                    ((string *)&local_c0,"solved  status_ipm should not be IPX_STATUS_debug",
                     &local_1a1);
          ipxStatusError(iVar1 == 10,options,&local_c0,-1);
          std::__cxx11::string::~string((string *)&local_c0);
          if (iVar1 != 10) {
            iVar1 = (ipx_info->super_ipx_info).status_crossover;
            std::__cxx11::string::string
                      ((string *)&local_e0,
                       "solved  status_crossover should not be IPX_STATUS_primal_infeas",&local_1a1)
            ;
            ipxStatusError(iVar1 == 3,options,&local_e0,-1);
            std::__cxx11::string::~string((string *)&local_e0);
            if (iVar1 != 3) {
              iVar1 = (ipx_info->super_ipx_info).status_crossover;
              std::__cxx11::string::string
                        ((string *)&local_100,
                         "solved  status_crossover should not be IPX_STATUS_dual_infeas",&local_1a1)
              ;
              ipxStatusError(iVar1 == 4,options,&local_100,-1);
              std::__cxx11::string::~string((string *)&local_100);
              if (iVar1 != 4) {
                iVar1 = (ipx_info->super_ipx_info).status_crossover;
                std::__cxx11::string::string
                          ((string *)&local_120,
                           "solved  status_crossover should not be IPX_STATUS_time_limit",&local_1a1
                          );
                ipxStatusError(iVar1 == 6,options,&local_120,-1);
                std::__cxx11::string::~string((string *)&local_120);
                if (iVar1 != 6) {
                  iVar1 = (ipx_info->super_ipx_info).status_crossover;
                  std::__cxx11::string::string
                            ((string *)&local_140,
                             "solved  status_crossover should not be IPX_STATUS_iter_limit",
                             &local_1a1);
                  ipxStatusError(iVar1 == 7,options,&local_140,-1);
                  std::__cxx11::string::~string((string *)&local_140);
                  if (iVar1 != 7) {
                    iVar1 = (ipx_info->super_ipx_info).status_crossover;
                    std::__cxx11::string::string
                              ((string *)&local_160,
                               "solved  status_crossover should not be IPX_STATUS_no_progress",
                               &local_1a1);
                    ipxStatusError(iVar1 == 8,options,&local_160,-1);
                    std::__cxx11::string::~string((string *)&local_160);
                    if (iVar1 != 8) {
                      iVar1 = (ipx_info->super_ipx_info).status_crossover;
                      std::__cxx11::string::string
                                ((string *)&local_180,
                                 "solved  status_crossover should not be IPX_STATUS_failed",
                                 &local_1a1);
                      ipxStatusError(iVar1 == 9,options,&local_180,-1);
                      std::__cxx11::string::~string((string *)&local_180);
                      if (iVar1 != 9) {
                        iVar1 = (ipx_info->super_ipx_info).status_crossover;
                        std::__cxx11::string::string
                                  ((string *)&local_1a0,
                                   "solved  status_crossover should not be IPX_STATUS_debug",
                                   &local_1a1);
                        status_error = iVar1 == 10;
                        ipxStatusError(status_error,options,&local_1a0,-1);
                        std::__cxx11::string::~string((string *)&local_1a0);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return status_error;
}

Assistant:

bool illegalIpxSolvedStatus(const ipx::Info& ipx_info,
                            const HighsOptions& options) {
  bool found_illegal_status = false;
  //========
  // For IPX
  //========
  // Can solve and be optimal
  // Can solve and be imprecise
  // Can solve and be primal_infeas
  // Can solve and be dual_infeas
  // Cannot solve and reach time limit
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(ipx_info.status_ipm == IPX_STATUS_time_limit, options,
                     "solved  status_ipm should not be IPX_STATUS_time_limit");
  // Cannot solve and reach iteration limit
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(ipx_info.status_ipm == IPX_STATUS_iter_limit, options,
                     "solved  status_ipm should not be IPX_STATUS_iter_limit");
  // Cannot solve and make no progress
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(ipx_info.status_ipm == IPX_STATUS_no_progress, options,
                     "solved  status_ipm should not be IPX_STATUS_no_progress");
  // Cannot solve and failed
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(ipx_info.status_ipm == IPX_STATUS_failed, options,
                     "solved  status_ipm should not be IPX_STATUS_failed");
  // Cannot solve and debug
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(ipx_info.status_ipm == IPX_STATUS_debug, options,
                     "solved  status_ipm should not be IPX_STATUS_debug");
  //==============
  // For crossover
  //==============
  // Can solve and be optimal
  // Can solve and be imprecise
  // Cannot solve with primal infeasibility
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_primal_infeas, options,
          "solved  status_crossover should not be IPX_STATUS_primal_infeas");
  // Cannot solve with dual infeasibility
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_dual_infeas, options,
          "solved  status_crossover should not be IPX_STATUS_dual_infeas");
  // Cannot solve and reach time limit
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_time_limit, options,
          "solved  status_crossover should not be IPX_STATUS_time_limit");
  // Cannot solve and reach time limit
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_iter_limit, options,
          "solved  status_crossover should not be IPX_STATUS_iter_limit");
  // Cannot solve and make no progress
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_no_progress, options,
          "solved  status_crossover should not be IPX_STATUS_no_progress");
  // Cannot solve and failed
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_failed, options,
          "solved  status_crossover should not be IPX_STATUS_failed");
  // Cannot solve and debug
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(ipx_info.status_crossover == IPX_STATUS_debug, options,
                     "solved  status_crossover should not be IPX_STATUS_debug");
  return found_illegal_status;
}